

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LinearQuantizationParams::SerializeWithCachedSizes
          (LinearQuantizationParams *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<float> *pRVar2;
  float *pfVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LinearQuantizationParams *this_local;
  
  iVar1 = scale_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_scale_cached_byte_size_);
    pRVar2 = scale(this);
    pfVar3 = google::protobuf::RepeatedField<float>::data(pRVar2);
    iVar1 = scale_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(pfVar3,iVar1,output);
  }
  iVar1 = bias_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_bias_cached_byte_size_);
    pRVar2 = bias(this);
    pfVar3 = google::protobuf::RepeatedField<float>::data(pRVar2);
    iVar1 = bias_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(pfVar3,iVar1,output);
  }
  return;
}

Assistant:

void LinearQuantizationParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LinearQuantizationParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->scale_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scale_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->scale().data(), this->scale_size(), output);
  }

  // repeated float bias = 2;
  if (this->bias_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_bias_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->bias().data(), this->bias_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LinearQuantizationParams)
}